

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_table.c
# Opt level: O2

llmsset_t llmsset_create(size_t initial_size,size_t max_size)

{
  FILE *__stream;
  llmsset_t plVar1;
  uint64_t *puVar2;
  uint8_t *puVar3;
  int *piVar4;
  char *pcVar5;
  size_t sStack_20;
  
  plVar1 = (llmsset_t)alloc_aligned(0x70);
  if (plVar1 == (llmsset_t)0x0) {
LAB_00119334:
    __stream = _stderr;
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    fprintf(__stream,"llmsset_create: Unable to allocate memory: %s!\n",pcVar5);
  }
  else {
    if ((int)POPCOUNT(initial_size) == 1) {
      if ((int)POPCOUNT(max_size) == 1) {
        if (max_size < initial_size) {
          pcVar5 = "llmsset_create: initial_size > max_size!\n";
          sStack_20 = 0x29;
        }
        else {
          if (0x1ff < initial_size) {
            plVar1->max_size = max_size;
            plVar1->table_size = initial_size;
            plVar1->mask = initial_size - 1;
            LOCK();
            plVar1->threshold = (short)LZCOUNT(initial_size) * -2 + 0xc0;
            UNLOCK();
            puVar2 = (uint64_t *)alloc_aligned(max_size << 3);
            plVar1->table = puVar2;
            puVar3 = (uint8_t *)alloc_aligned(plVar1->max_size << 4);
            plVar1->data = puVar3;
            puVar2 = (uint64_t *)alloc_aligned(plVar1->max_size >> 0xc);
            plVar1->bitmap1 = puVar2;
            puVar2 = (uint64_t *)alloc_aligned(plVar1->max_size >> 3);
            plVar1->bitmap2 = puVar2;
            puVar2 = (uint64_t *)alloc_aligned(plVar1->max_size >> 3);
            plVar1->bitmapc = puVar2;
            if ((((plVar1->table != (uint64_t *)0x0) && (plVar1->data != (uint8_t *)0x0)) &&
                (plVar1->bitmap1 != (uint64_t *)0x0)) &&
               ((plVar1->bitmap2 != (uint64_t *)0x0 && (puVar2 != (uint64_t *)0x0)))) {
              LOCK();
              *plVar1->bitmap2 = 0xc000000000000000;
              UNLOCK();
              plVar1->hash_cb = (llmsset_hash_cb)0x0;
              plVar1->equals_cb = (llmsset_equals_cb)0x0;
              plVar1->create_cb = (llmsset_create_cb)0x0;
              plVar1->destroy_cb = (llmsset_destroy_cb)0x0;
              llmsset_reset_region_TOGETHER();
              sylvan_init_hash();
              return plVar1;
            }
            goto LAB_00119334;
          }
          pcVar5 = "llmsset_create: initial_size too small!\n";
          sStack_20 = 0x28;
        }
      }
      else {
        pcVar5 = "llmsset_create: max_size is not a power of 2!\n";
        sStack_20 = 0x2e;
      }
    }
    else {
      pcVar5 = "llmsset_create: initial_size is not a power of 2!\n";
      sStack_20 = 0x32;
    }
    fwrite(pcVar5,sStack_20,1,_stderr);
  }
  exit(1);
}

Assistant:

llmsset_t
llmsset_create(size_t initial_size, size_t max_size)
{
    llmsset_t dbs = alloc_aligned(sizeof(struct llmsset));
    if (dbs == 0) {
        fprintf(stderr, "llmsset_create: Unable to allocate memory: %s!\n", strerror(errno));
        exit(1);
    }

#if LLMSSET_MASK
    /* Check if initial_size and max_size are powers of 2 */
    if (__builtin_popcountll(initial_size) != 1) {
        fprintf(stderr, "llmsset_create: initial_size is not a power of 2!\n");
        exit(1);
    }

    if (__builtin_popcountll(max_size) != 1) {
        fprintf(stderr, "llmsset_create: max_size is not a power of 2!\n");
        exit(1);
    }
#endif

    if (initial_size > max_size) {
        fprintf(stderr, "llmsset_create: initial_size > max_size!\n");
        exit(1);
    }

    // minimum size is now 512 buckets (region size, but of course, n_workers * 512 is suggested as minimum)

    if (initial_size < 512) {
        fprintf(stderr, "llmsset_create: initial_size too small!\n");
        exit(1);
    }

    dbs->max_size = max_size;
    llmsset_set_size(dbs, initial_size);

    /* This implementation of "resizable hash table" allocates the max_size table in virtual memory,
       but only uses the "actual size" part in real memory */

    dbs->table = (_Atomic(uint64_t)*) alloc_aligned(dbs->max_size * 8);
    dbs->data = (uint8_t*) alloc_aligned(dbs->max_size * 16);

    /* Also allocate bitmaps. Each region is 64*8 = 512 buckets.
       Overhead of bitmap1: 1 bit per 4096 bucket.
       Overhead of bitmap2: 1 bit per bucket.
       Overhead of bitmapc: 1 bit per bucket. */

    dbs->bitmap1 = (_Atomic(uint64_t)*)alloc_aligned(dbs->max_size / (512*8));
    dbs->bitmap2 = (_Atomic(uint64_t)*)alloc_aligned(dbs->max_size / 8);
    dbs->bitmapc = (uint64_t*)alloc_aligned(dbs->max_size / 8);

    if (dbs->table == 0 || dbs->data == 0 || dbs->bitmap1 == 0 || dbs->bitmap2 == 0 || dbs->bitmapc == 0) {
        fprintf(stderr, "llmsset_create: Unable to allocate memory: %s!\n", strerror(errno));
        exit(1);
    }

#if defined(madvise) && defined(MADV_RANDOM)
    madvise(dbs->table, dbs->max_size * 8, MADV_RANDOM);
#endif

    // forbid first two positions (index 0 and 1)
    dbs->bitmap2[0] = 0xc000000000000000LL;

    dbs->hash_cb = NULL;
    dbs->equals_cb = NULL;
    dbs->create_cb = NULL;
    dbs->destroy_cb = NULL;

    // yes, ugly. for now, we use a global thread-local value.
    // that is a problem with multiple tables.
    // so, for now, do NOT use multiple tables!!

    INIT_THREAD_LOCAL(my_region);
    TOGETHER(llmsset_reset_region);

    // initialize hashtab
    sylvan_init_hash();

    return dbs;
}